

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

BOOL IsDBCSLeadByteEx(UINT CodePage,BYTE TestChar)

{
  BOOL BVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  undefined1 local_34 [8];
  CPINFO cpinfo;
  
  cpinfo._12_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if (PAL_InitializeChakraCoreCalled) {
    BVar1 = GetCPInfo(CodePage,(LPCPINFO)local_34);
    if (BVar1 == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012d571;
      SetLastError(0x57);
      BVar1 = 0;
    }
    else {
      uVar2 = 0xfffffffffffffffe;
      BVar1 = 0;
      do {
        if (cpinfo.DefaultChar[uVar2 - 4] == 0) break;
        if ((cpinfo.DefaultChar[uVar2 - 4] <= TestChar) &&
           (TestChar <= cpinfo.DefaultChar[uVar2 - 3])) {
          BVar1 = 1;
          break;
        }
        uVar2 = uVar2 + 2;
      } while (uVar2 < 10);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      if (*(long *)(in_FS_OFFSET + 0x28) != cpinfo._12_8_) {
        __stack_chk_fail();
      }
      return BVar1;
    }
  }
LAB_0012d571:
  abort();
}

Assistant:

BOOL
PALAPI
IsDBCSLeadByteEx(
     IN UINT CodePage,
     IN BYTE TestChar)
{
    CPINFO cpinfo;
    SIZE_T i;
    BOOL bRet = FALSE;

    PERF_ENTRY(IsDBCSLeadByteEx);
    ENTRY("IsDBCSLeadByteEx(CodePage=%#x, TestChar=%d)\n", CodePage, TestChar);

    /* Get the lead byte info with respect to the given codepage*/
    if( !GetCPInfo( CodePage, &cpinfo ) )
    {
        ERROR("Error CodePage(%#x) parameter is invalid\n", CodePage );
        SetLastError( ERROR_INVALID_PARAMETER );
        goto done;
    }

    for( i=0; i < sizeof(cpinfo.LeadByte)/sizeof(cpinfo.LeadByte[0]); i += 2 )
    {
        if( 0 == cpinfo.LeadByte[ i ] )
        {
            goto done;
        }

        /*check if the given char is in one of the lead byte ranges*/
        if( cpinfo.LeadByte[i] <= TestChar && TestChar<= cpinfo.LeadByte[i+1] )
        {
            bRet = TRUE;
            goto done;
        }
    }
done:
    LOGEXIT("IsDBCSLeadByteEx returns BOOL %d\n",bRet);
    PERF_EXIT(IsDBCSLeadByteEx);
    return bRet;
}